

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int gmatch(lua_State *L)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 *puVar3;
  size_t lp;
  size_t ls;
  
  pcVar1 = luaL_checklstring(L,1,&ls);
  pcVar2 = luaL_checklstring(L,2,&lp);
  lua_settop(L,2);
  puVar3 = (undefined8 *)lua_newuserdata(L,0x240);
  puVar3[6] = L;
  *(undefined4 *)(puVar3 + 7) = 200;
  puVar3[3] = pcVar1;
  puVar3[4] = pcVar1 + ls;
  puVar3[5] = pcVar2 + lp;
  *puVar3 = pcVar1;
  puVar3[1] = pcVar2;
  puVar3[2] = 0;
  lua_pushcclosure(L,gmatch_aux,3);
  return 1;
}

Assistant:

static int gmatch(lua_State *L) {
    size_t ls, lp;
    const char *s = luaL_checklstring(L, 1, &ls);
    const char *p = luaL_checklstring(L, 2, &lp);
    GMatchState *gm;
    lua_settop(L, 2);  /* keep them on closure to avoid being collected */
    gm = (GMatchState *) lua_newuserdata(L, sizeof(GMatchState));
    prepstate(&gm->ms, L, s, ls, p, lp);
    gm->src = s;
    gm->p = p;
    gm->lastmatch = NULL;
    lua_pushcclosure(L, gmatch_aux, 3);
    return 1;
}